

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O0

void Amap_LibVerifyPerm(Amap_Lib_t *pLib,Amap_Gat_t *pGate,Kit_DsdNtk_t *pNtk,Amap_Nod_t *pNod,
                       int *pArray)

{
  Vec_Ptr_t *p;
  int iVar1;
  uint local_5c;
  int local_58;
  int iInput;
  int nWords;
  int i;
  uint *pTruth;
  Vec_Int_t *vTruth;
  Vec_Ptr_t *vTtElemsPol;
  Vec_Ptr_t *vTtElems;
  int *pArray_local;
  Amap_Nod_t *pNod_local;
  Kit_DsdNtk_t *pNtk_local;
  Amap_Gat_t *pGate_local;
  Amap_Lib_t *pLib_local;
  
  local_5c = 0;
  vTtElems = (Vec_Ptr_t *)pArray;
  pArray_local = (int *)pNod;
  pNod_local = (Amap_Nod_t *)pNtk;
  pNtk_local = (Kit_DsdNtk_t *)pGate;
  pGate_local = (Amap_Gat_t *)pLib;
  if (*(uint *)&pGate->field_0x38 >> 0x18 < 2) {
    __assert_fail("pGate->nPins > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0x122,
                  "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
                 );
  }
  local_58 = Kit_TruthWordNum(*(uint *)&pGate->field_0x38 >> 0x18);
  pTruth = (uint *)Vec_IntAlloc(local_58 * 0xf);
  vTtElemsPol = Vec_PtrAllocTruthTables(*(uint *)&pNtk_local[1].pNodes >> 0x18);
  vTruth = (Vec_Int_t *)Vec_PtrAlloc(*(uint *)&pNtk_local[1].pNodes >> 0x18);
  for (iInput = 0; p = vTtElemsPol, iInput < (int)(*(uint *)&pNtk_local[1].pNodes >> 0x18);
      iInput = iInput + 1) {
    iVar1 = Abc_Lit2Var((&vTtElems->nCap)[iInput]);
    _nWords = (uint *)Vec_PtrEntry(p,iVar1);
    iVar1 = Abc_LitIsCompl((&vTtElems->nCap)[iInput]);
    if (iVar1 != 0) {
      Kit_TruthNot(_nWords,_nWords,*(uint *)&pNtk_local[1].pNodes >> 0x18);
    }
    Vec_PtrPush((Vec_Ptr_t *)vTruth,_nWords);
  }
  _nWords = Amap_LibVerifyPerm_rec
                      ((Amap_Lib_t *)pGate_local,(Amap_Nod_t *)pArray_local,(Vec_Ptr_t *)vTruth,
                       (Vec_Int_t *)pTruth,local_58,(int *)&local_5c);
  if (local_5c == *(uint *)&pNtk_local[1].pNodes >> 0x18) {
    iVar1 = Abc_LitIsCompl((uint)(ushort)pNod_local->iFan1);
    if (iVar1 != 0) {
      Kit_TruthNot(_nWords,_nWords,*(uint *)&pNtk_local[1].pNodes >> 0x18);
    }
    iVar1 = Kit_TruthIsEqual(pNtk_local[1].pSupps,_nWords,*(uint *)&pNtk_local[1].pNodes >> 0x18);
    if (iVar1 == 0) {
      printf("Verification failed for gate %d (%s) and node %d.\n",
             (ulong)(*(uint *)&pNtk_local[1].pNodes & 0x7fffff),pNtk_local[1].pMem,
             (ulong)(*pArray_local & 0xffff));
    }
    Vec_IntFree((Vec_Int_t *)pTruth);
    Vec_PtrFree(vTtElemsPol);
    Vec_PtrFree((Vec_Ptr_t *)vTruth);
    return;
  }
  __assert_fail("iInput == (int)pGate->nPins",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                ,0x132,
                "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
               );
}

Assistant:

void Amap_LibVerifyPerm( Amap_Lib_t * pLib, Amap_Gat_t * pGate, Kit_DsdNtk_t * pNtk, Amap_Nod_t * pNod, int * pArray )
{
    Vec_Ptr_t * vTtElems;
    Vec_Ptr_t * vTtElemsPol;
    Vec_Int_t * vTruth;
    unsigned * pTruth;
    int i, nWords;
    int iInput = 0;

    // allocate storage for truth tables
    assert( pGate->nPins > 1 );
    nWords = Kit_TruthWordNum( pGate->nPins );
    vTruth = Vec_IntAlloc( nWords * AMAP_MAXINS );
    vTtElems = Vec_PtrAllocTruthTables( pGate->nPins );
    vTtElemsPol = Vec_PtrAlloc( pGate->nPins );
    for ( i = 0; i < (int)pGate->nPins; i++ )
    {
        pTruth = (unsigned *)Vec_PtrEntry( vTtElems, Abc_Lit2Var(pArray[i]) );
        if ( Abc_LitIsCompl( pArray[i] ) )
            Kit_TruthNot( pTruth, pTruth, pGate->nPins );
        Vec_PtrPush( vTtElemsPol, pTruth );
    }
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 0), 4 ); printf("\n" );
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 1), 4 ); printf("\n" );
    // compute the truth table recursively
    pTruth = Amap_LibVerifyPerm_rec( pLib, pNod, vTtElemsPol, vTruth, nWords, &iInput );
    assert( iInput == (int)pGate->nPins );
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruth, pTruth, pGate->nPins );
//Extra_PrintBinary( stdout, pTruth, 4 ); printf("\n" );
//Extra_PrintBinary( stdout, pGate->pFunc, 4 ); printf("\n" );
    // compare
    if ( !Kit_TruthIsEqual(pGate->pFunc, pTruth, pGate->nPins) )
        printf( "Verification failed for gate %d (%s) and node %d.\n",
            pGate->Id, pGate->pForm, pNod->Id );
    Vec_IntFree( vTruth );
    Vec_PtrFree( vTtElems );
    Vec_PtrFree( vTtElemsPol );
}